

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O1

void __thiscall OpenMD::NPA::moveA(NPA *this)

{
  Thermo *this_00;
  Mat3x3d *pMVar1;
  undefined8 *puVar2;
  Snapshot *pSVar3;
  RotationAlgorithm *pRVar4;
  RealType RVar5;
  long lVar6;
  undefined8 uVar7;
  double dVar8;
  uint i_1;
  uint uVar9;
  Molecule *pMVar10;
  Vector3d *pVVar11;
  double dVar12;
  uint i_6;
  long lVar13;
  double *pdVar14;
  pointer pVVar15;
  pointer ppSVar16;
  ulong uVar17;
  uint i_5;
  long lVar18;
  StuntDouble *pSVar19;
  int iVar20;
  MoleculeIterator i;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result_3;
  Vector3d vel;
  Vector3d pos;
  Vector<double,_3U> result;
  Vector3d ji;
  Vector3d sc;
  Vector3d frc;
  Vector3d Tb;
  Vector3d COM;
  MoleculeIterator local_1a0;
  Vector3d local_198;
  Vector3d local_178;
  double local_160;
  double local_158 [4];
  double local_138 [4];
  double local_118 [4];
  double local_f8 [4];
  double local_d8 [4];
  double local_b8 [4];
  double local_98 [4];
  Mat3x3d local_78;
  
  local_1a0._M_node = (_Base_ptr)0x0;
  local_98[2] = 0.0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_f8[2] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_158[2] = 0.0;
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  local_138[2] = 0.0;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_b8[2] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_d8[2] = 0.0;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x18])();
  this_00 = &(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar5 = Thermo::getTemperature(this_00);
  (this->super_NPT).instaTemp = RVar5;
  Thermo::getPressureTensor(&local_78,this_00);
  pMVar1 = &(this->super_NPT).press;
  if (pMVar1 != &local_78) {
    lVar13 = 0;
    do {
      *(undefined8 *)((long)(&this->eta + -1) + lVar13) =
           *(undefined8 *)
            ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar13 + 0x10);
      uVar7 = *(undefined8 *)
               ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar13 + 8);
      puVar2 = (undefined8 *)
               ((long)(pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar13);
      *puVar2 = *(undefined8 *)
                 ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar13);
      puVar2[1] = uVar7;
      lVar13 = lVar13 + 0x18;
    } while (lVar13 != 0x48);
  }
  (this->super_NPT).instaPress =
       (((this->super_NPT).press.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
         data_[0][0] +
         (this->super_NPT).press.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
         data_[1][1] +
        (this->super_NPT).press.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        [2][2]) * 163882576.0) / 3.0;
  RVar5 = Thermo::getVolume(this_00);
  (this->super_NPT).instaVol = RVar5;
  Thermo::getCom((Vector3d *)&local_78,this_00);
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x13])(this);
  pMVar10 = SimInfo::beginMolecule
                      ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                       &local_1a0);
  if (pMVar10 != (Molecule *)0x0) {
    do {
      ppSVar16 = (pMVar10->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (ppSVar16 ==
            (pMVar10->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar19 = (StuntDouble *)0x0;
        }
        else {
          pSVar19 = *ppSVar16;
        }
        if (pSVar19 == (StuntDouble *)0x0) break;
        pSVar3 = pSVar19->snapshotMan_->currentSnapshot_;
        lVar13 = *(long *)((long)&(pSVar3->atomData).velocity.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar19->storage_);
        lVar18 = (long)pSVar19->localIndex_ * 0x18;
        pdVar14 = (double *)(lVar13 + lVar18);
        local_158[0] = *pdVar14;
        local_158[1] = pdVar14[1];
        local_158[2] = *(double *)(lVar13 + 0x10 + lVar18);
        lVar13 = *(long *)((long)&(pSVar3->atomData).force.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar19->storage_);
        local_b8[2] = *(double *)(lVar13 + 0x10 + lVar18);
        pdVar14 = (double *)(lVar13 + lVar18);
        local_b8[0] = *pdVar14;
        local_b8[1] = pdVar14[1];
        local_160 = pSVar19->mass_;
        (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x10])
                  (this,local_d8,local_158);
        dVar12 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
        local_178.super_Vector<double,_3U>.data_[0] = 0.0;
        local_178.super_Vector<double,_3U>.data_[1] = 0.0;
        local_178.super_Vector<double,_3U>.data_[2] = 0.0;
        lVar13 = 0;
        do {
          local_178.super_Vector<double,_3U>.data_[lVar13] =
               local_b8[lVar13] * ((dVar12 * 0.0004184) / local_160);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        local_118[0] = 0.0;
        local_118[1] = 0.0;
        local_118[2] = 0.0;
        lVar13 = 0;
        do {
          local_118[lVar13] = local_d8[lVar13] * dVar12;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        local_198.super_Vector<double,_3U>.data_[0] = 0.0;
        local_198.super_Vector<double,_3U>.data_[1] = 0.0;
        local_198.super_Vector<double,_3U>.data_[2] = 0.0;
        lVar13 = 0;
        do {
          local_198.super_Vector<double,_3U>.data_[lVar13] =
               local_178.super_Vector<double,_3U>.data_[lVar13] - local_118[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        lVar13 = 0;
        do {
          local_158[lVar13] = local_198.super_Vector<double,_3U>.data_[lVar13] + local_158[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        pSVar3 = pSVar19->snapshotMan_->currentSnapshot_;
        lVar13 = (long)pSVar19->localIndex_ * 0x18;
        pdVar14 = (double *)
                  (*(long *)((long)&(pSVar3->atomData).velocity.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar19->storage_) +
                  lVar13);
        if (pdVar14 != local_158) {
          lVar18 = 0;
          do {
            pdVar14[lVar18] = local_158[lVar18];
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
        }
        if (pSVar19->objType_ - otDAtom < 2) {
          pVVar11 = (Vector3d *)
                    (lVar13 + *(long *)((long)&(pSVar3->atomData).torque.
                                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                       pSVar19->storage_));
          local_178.super_Vector<double,_3U>.data_[0] = 0.0;
          local_178.super_Vector<double,_3U>.data_[1] = 0.0;
          local_178.super_Vector<double,_3U>.data_[2] = 0.0;
          if (pVVar11 != &local_178) {
            lVar13 = 0;
            do {
              local_178.super_Vector<double,_3U>.data_[lVar13] =
                   (pVVar11->super_Vector<double,_3U>).data_[lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
          }
          StuntDouble::lab2Body(&local_198,pSVar19,&local_178);
          local_98[2] = local_198.super_Vector<double,_3U>.data_[2];
          local_98[0] = local_198.super_Vector<double,_3U>.data_[0];
          local_98[1] = local_198.super_Vector<double,_3U>.data_[1];
          lVar13 = *(long *)((long)&(pSVar19->snapshotMan_->currentSnapshot_->atomData).
                                    angularMomentum.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar19->storage_);
          pdVar14 = (double *)(lVar13 + (long)pSVar19->localIndex_ * 0x18);
          local_f8[2] = (double)*(undefined8 *)(lVar13 + 0x10 + (long)pSVar19->localIndex_ * 0x18);
          local_f8[0] = *pdVar14;
          local_f8[1] = pdVar14[1];
          dVar12 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
          local_198.super_Vector<double,_3U>.data_[0] = 0.0;
          local_198.super_Vector<double,_3U>.data_[1] = 0.0;
          local_198.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar13 = 0;
          do {
            local_198.super_Vector<double,_3U>.data_[lVar13] = local_98[lVar13] * dVar12 * 0.0004184
            ;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          lVar13 = 0;
          do {
            local_f8[lVar13] = local_198.super_Vector<double,_3U>.data_[lVar13] + local_f8[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          pRVar4 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.rotAlgo_;
          (*pRVar4->_vptr_RotationAlgorithm[2])
                    (SUB84((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt,0),
                     pRVar4,pSVar19,local_f8);
          pdVar14 = (double *)
                    ((long)pSVar19->localIndex_ * 0x18 +
                    *(long *)((long)&(pSVar19->snapshotMan_->currentSnapshot_->atomData).
                                     angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + pSVar19->storage_))
          ;
          if (pdVar14 != local_f8) {
            lVar13 = 0;
            do {
              pdVar14[lVar13] = local_f8[lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
          }
        }
        ppSVar16 = ppSVar16 + 1;
      }
      pMVar10 = SimInfo::nextMolecule
                          ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                           &local_1a0);
    } while (pMVar10 != (Molecule *)0x0);
  }
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x15])(this);
  (*((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[4])();
  pMVar10 = SimInfo::beginMolecule
                      ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                       &local_1a0);
  if (pMVar10 != (Molecule *)0x0) {
    iVar20 = 0;
    do {
      ppSVar16 = (pMVar10->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar16 ==
          (pMVar10->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar19 = (StuntDouble *)0x0;
      }
      else {
        pSVar19 = *ppSVar16;
      }
      if (pSVar19 != (StuntDouble *)0x0) {
        pVVar15 = (this->super_NPT).oldPos.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar20;
        do {
          ppSVar16 = ppSVar16 + 1;
          lVar13 = *(long *)((long)&(pSVar19->snapshotMan_->currentSnapshot_->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar19->storage_);
          pdVar14 = (double *)(lVar13 + (long)pSVar19->localIndex_ * 0x18);
          dVar12 = *pdVar14;
          dVar8 = pdVar14[1];
          (pVVar15->super_Vector<double,_3U>).data_[2] =
               *(double *)(lVar13 + 0x10 + (long)pSVar19->localIndex_ * 0x18);
          (pVVar15->super_Vector<double,_3U>).data_[0] = dVar12;
          (pVVar15->super_Vector<double,_3U>).data_[1] = dVar8;
          if (ppSVar16 ==
              (pMVar10->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pSVar19 = (StuntDouble *)0x0;
          }
          else {
            pSVar19 = *ppSVar16;
          }
          pVVar15 = pVVar15 + 1;
          iVar20 = iVar20 + 1;
        } while (pSVar19 != (StuntDouble *)0x0);
      }
      pMVar10 = SimInfo::nextMolecule
                          ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                           &local_1a0);
    } while (pMVar10 != (Molecule *)0x0);
  }
  if (0 < (this->super_NPT).maxIterNum_) {
    dVar12 = 0.0;
    do {
      local_160 = dVar12;
      pMVar10 = SimInfo::beginMolecule
                          ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                           &local_1a0);
      if (pMVar10 != (Molecule *)0x0) {
        uVar17 = 0;
        do {
          ppSVar16 = (pMVar10->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (ppSVar16 ==
              (pMVar10->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pSVar19 = (StuntDouble *)0x0;
          }
          else {
            pSVar19 = *ppSVar16;
          }
          if (pSVar19 != (StuntDouble *)0x0) {
            uVar17 = (ulong)(int)uVar17;
            lVar13 = uVar17 * 0x18;
            do {
              pSVar3 = pSVar19->snapshotMan_->currentSnapshot_;
              lVar18 = *(long *)((long)&(pSVar3->atomData).velocity.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar19->storage_);
              lVar6 = (long)pSVar19->localIndex_ * 0x18;
              pdVar14 = (double *)(lVar18 + lVar6);
              local_158[0] = *pdVar14;
              local_158[1] = pdVar14[1];
              local_158[2] = *(double *)(lVar18 + 0x10 + lVar6);
              lVar18 = *(long *)((long)&(pSVar3->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar19->storage_);
              pdVar14 = (double *)(lVar18 + lVar6);
              local_138[0] = *pdVar14;
              local_138[1] = pdVar14[1];
              local_138[2] = *(double *)(lVar18 + 0x10 + lVar6);
              (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator
                [0x12])(this,local_138,&local_78,uVar17 & 0xffffffff,local_d8);
              pVVar15 = (this->super_NPT).oldPos.
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              dVar12 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt;
              local_118[0] = 0.0;
              local_118[1] = 0.0;
              local_118[2] = 0.0;
              lVar18 = 0;
              do {
                local_118[lVar18] = local_158[lVar18] + local_d8[lVar18];
                lVar18 = lVar18 + 1;
              } while (lVar18 != 3);
              local_178.super_Vector<double,_3U>.data_[0] = 0.0;
              local_178.super_Vector<double,_3U>.data_[1] = 0.0;
              local_178.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar18 = 0;
              do {
                local_178.super_Vector<double,_3U>.data_[lVar18] = local_118[lVar18] * dVar12;
                lVar18 = lVar18 + 1;
              } while (lVar18 != 3);
              local_198.super_Vector<double,_3U>.data_[0] = 0.0;
              local_198.super_Vector<double,_3U>.data_[1] = 0.0;
              local_198.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar18 = 0;
              do {
                local_198.super_Vector<double,_3U>.data_[lVar18] =
                     *(double *)
                      ((long)(pVVar15->super_Vector<double,_3U>).data_ + lVar18 * 8 + lVar13) +
                     local_178.super_Vector<double,_3U>.data_[lVar18];
                lVar18 = lVar18 + 1;
              } while (lVar18 != 3);
              local_138[2] = local_198.super_Vector<double,_3U>.data_[2];
              local_138[0] = local_198.super_Vector<double,_3U>.data_[0];
              local_138[1] = local_198.super_Vector<double,_3U>.data_[1];
              pdVar14 = (double *)
                        ((long)pSVar19->localIndex_ * 0x18 +
                        *(long *)((long)&(pSVar19->snapshotMan_->currentSnapshot_->atomData).
                                         position.
                                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                 pSVar19->storage_));
              if (pdVar14 != local_138) {
                lVar18 = 0;
                do {
                  pdVar14[lVar18] = local_138[lVar18];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 3);
              }
              ppSVar16 = ppSVar16 + 1;
              if (ppSVar16 ==
                  (pMVar10->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                pSVar19 = (StuntDouble *)0x0;
              }
              else {
                pSVar19 = *ppSVar16;
              }
              uVar17 = uVar17 + 1;
              lVar13 = lVar13 + 0x18;
            } while (pSVar19 != (StuntDouble *)0x0);
          }
          pMVar10 = SimInfo::nextMolecule
                              ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.
                               info_,&local_1a0);
        } while (pMVar10 != (Molecule *)0x0);
      }
      Rattle::constraintA((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.rattle_)
      ;
      uVar9 = SUB84(local_160,0) + 1;
      dVar12 = (double)(ulong)uVar9;
    } while ((int)uVar9 < (this->super_NPT).maxIterNum_);
  }
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x17])(this);
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x19])(this);
  return;
}

Assistant:

void NPA::moveA() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d Tb, ji;
    RealType mass;
    Vector3d vel;
    Vector3d pos;
    Vector3d frc;
    Vector3d sc;
    int index;

    loadEta();

    instaTemp  = thermo.getTemperature();
    press      = thermo.getPressureTensor();
    instaPress = Constants::pressureConvert *
                 (press(0, 0) + press(1, 1) + press(2, 2)) / 3.0;
    instaVol = thermo.getVolume();

    Vector3d COM = thermo.getCom();

    // evolve velocity half step

    calcVelScale();

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel = sd->getVel();
        frc = sd->getFrc();

        mass = sd->getMass();

        getVelScaleA(sc, vel);

        // velocity half step  (use chi from previous step here):

        vel += dt2 * Constants::energyConvert / mass * frc - dt2 * sc;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji += dt2 * Constants::energyConvert * Tb;

          rotAlgo_->rotate(sd, ji, dt);

          sd->setJ(ji);
        }
      }
    }
    // evolve eta a half step

    evolveEtaA();
    flucQ_->moveA();

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldPos[index++] = sd->getPos();
      }
    }

    // the first estimation of r(t+dt) is equal to  r(t)

    for (int k = 0; k < maxIterNum_; k++) {
      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          vel = sd->getVel();
          pos = sd->getPos();

          this->getPosScale(pos, COM, index, sc);

          pos = oldPos[index] + dt * (vel + sc);
          sd->setPos(pos);

          ++index;
        }
      }

      rattle_->constraintA();
    }

    // Scale the box after all the positions have been moved:

    this->scaleSimBox();

    saveEta();
  }